

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void log_secret(ptls_t *tls,char *type,ptls_iovec_t secret)

{
  char local_b8 [8];
  char hexbuf [129];
  char *type_local;
  ptls_t *tls_local;
  ptls_iovec_t secret_local;
  
  if (tls->ctx->log_event != (ptls_log_event_t *)0x0) {
    ptls_hexdump(local_b8,secret.base,secret.len);
    (*tls->ctx->log_event->cb)(tls->ctx->log_event,tls,type,"%s",local_b8);
  }
  return;
}

Assistant:

static void log_secret(ptls_t *tls, const char *type, ptls_iovec_t secret)
{
    if (tls->ctx->log_event != NULL) {
        char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];
        ptls_hexdump(hexbuf, secret.base, secret.len);
        tls->ctx->log_event->cb(tls->ctx->log_event, tls, type, "%s", hexbuf);
    }
}